

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,ImDrawFlags flags)

{
  ImU32 IVar1;
  ImU32 IVar2;
  uint uVar3;
  uint flags_00;
  uint flags_01;
  byte bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 local_b8;
  ImVec2 local_b0;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  flags_00 = 0xf0;
  if ((flags & 0x1f0U) != 0) {
    flags_00 = flags;
  }
  local_b8 = p_max;
  local_b0 = p_min;
  if (col < 0xff000000) {
    local_88 = grid_off;
    IVar1 = ImAlphaBlendColors(0xffcccccc,col);
    IVar1 = GetColorU32(IVar1);
    IVar2 = ImAlphaBlendColors(0xff808080,col);
    IVar2 = GetColorU32(IVar2);
    ImDrawList::AddRectFilled(draw_list,&local_b0,&local_b8,IVar1,rounding,flags_00);
    local_78 = ZEXT416((uint)local_b0.y);
    local_68 = local_88.y + local_b0.y;
    if (local_68 < local_b8.y) {
      local_88.x = local_88.x + local_b0.x;
      bVar4 = 0;
      local_a4 = local_b8.y;
      local_58 = ZEXT416((uint)local_b0.x);
      local_a8 = local_b8.x;
      fVar6 = local_b8.y;
      fVar7 = local_b0.x;
      fVar8 = local_b8.x;
      fStack_64 = local_88.y;
      fStack_60 = local_88.y;
      fStack_5c = local_88.y;
      do {
        fVar5 = fVar6;
        if (local_68 <= fVar6) {
          fVar5 = local_68;
        }
        uStack_44 = (uint)fStack_64 & local_78._4_4_;
        uStack_40 = (uint)fStack_60 & local_78._8_4_;
        uStack_3c = (uint)fStack_5c & local_78._12_4_;
        local_90.y = (float)(-(uint)(local_68 < (float)local_78._0_4_) & local_78._0_4_ |
                            ~-(uint)(local_68 < (float)local_78._0_4_) & (uint)fVar5);
        local_68 = local_68 + grid_step;
        local_98.y = local_68;
        if (fVar6 <= local_68) {
          local_98.y = fVar6;
        }
        if (local_90.y < local_98.y) {
          local_9c = (float)bVar4 * grid_step + local_88.x;
          local_a0 = local_98.y;
          local_48 = local_90.y;
          if (local_9c < fVar8) {
            do {
              fVar5 = fVar8;
              if (local_9c <= fVar8) {
                fVar5 = local_9c;
              }
              local_90.x = (float)(-(uint)(local_9c < fVar7) & (uint)fVar7 |
                                  ~-(uint)(local_9c < fVar7) & (uint)fVar5);
              local_98.x = local_9c + grid_step;
              if (fVar8 <= local_9c + grid_step) {
                local_98.x = fVar8;
              }
              if (local_90.x < local_98.x) {
                uVar3 = 0x100;
                if ((local_90.y <= (float)local_78._0_4_) &&
                   (uVar3 = (local_90.x <= fVar7 | 0x10) << 4, fVar8 <= local_98.x)) {
                  uVar3 = uVar3 | 0x20;
                }
                if (fVar6 <= local_98.y) {
                  if (local_90.x <= fVar7) {
                    uVar3 = uVar3 | 0x40;
                  }
                  if (fVar8 <= local_98.x) {
                    uVar3 = uVar3 | 0x80;
                  }
                }
                flags_01 = uVar3 & flags_00;
                if (uVar3 == 0x100) {
                  flags_01 = 0x100;
                }
                if (flags_00 == 0x100) {
                  flags_01 = 0x100;
                }
                ImDrawList::AddRectFilled(draw_list,&local_90,&local_98,IVar2,rounding,flags_01);
                fVar6 = local_a4;
                fVar7 = (float)local_58._0_4_;
                fVar8 = local_a8;
                local_98.y = local_a0;
                local_90.y = local_48;
              }
              local_9c = local_9c + grid_step + grid_step;
            } while (local_9c < fVar8);
          }
        }
        bVar4 = bVar4 ^ 1;
      } while (local_68 < fVar6);
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&local_b0,&local_b8,col,rounding,flags_00);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, ImDrawFlags flags)
{
    if ((flags & ImDrawFlags_RoundCornersMask_) == 0)
        flags = ImDrawFlags_RoundCornersDefault_;
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                ImDrawFlags cell_flags = ImDrawFlags_RoundCornersNone;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersTopLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersTopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersBottomLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersBottomRight; }

                // Combine flags
                cell_flags = (flags == ImDrawFlags_RoundCornersNone || cell_flags == ImDrawFlags_RoundCornersNone) ? ImDrawFlags_RoundCornersNone : (cell_flags & flags);
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding, cell_flags);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, flags);
    }
}